

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_m33f(exr_context_t ctxt,exr_attribute_t *a)

{
  long in_RSI;
  exr_attr_m33f_t tmp;
  exr_result_t rv;
  void *in_stack_ffffffffffffffc8;
  exr_context_t in_stack_ffffffffffffffd0;
  exr_context_t in_stack_ffffffffffffffd8;
  exr_result_t local_14;
  
  memcpy(&stack0xffffffffffffffc8,*(void **)(in_RSI + 0x18),0x24);
  local_14 = save_attr_sz(in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
  if (local_14 == 0) {
    local_14 = save_attr_32(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  }
  return local_14;
}

Assistant:

static exr_result_t
save_m33f (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t    rv;
    exr_attr_m33f_t tmp = *(a->m33f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_m33f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 9);
    return rv;
}